

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::BuildFileCollectingErrors
          (DescriptorPool *this,FileDescriptorProto *proto,ErrorCollector *error_collector)

{
  FileDescriptor *pFVar1;
  long *in_RDI;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  LogMessage *in_stack_fffffffffffffe00;
  DescriptorBuilder *this_00;
  undefined8 in_stack_fffffffffffffe08;
  LogLevel_conflict level;
  LogMessage *in_stack_fffffffffffffe10;
  ErrorCollector *in_stack_fffffffffffffe48;
  Tables *in_stack_fffffffffffffe50;
  DescriptorBuilder *in_stack_fffffffffffffe58;
  DescriptorBuilder *in_stack_fffffffffffffe60;
  
  level = (LogLevel_conflict)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  if (in_RDI[1] != 0) {
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffe10,level,(char *)in_stack_fffffffffffffe00,
               in_stack_fffffffffffffdfc);
    internal::LogMessage::operator<<
              (in_stack_fffffffffffffe00,
               (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    internal::LogMessage::operator<<
              (in_stack_fffffffffffffe00,
               (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffe00,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    internal::LogMessage::~LogMessage((LogMessage *)0x4ba15a);
  }
  if (*in_RDI != 0) {
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffe10,level,(char *)in_stack_fffffffffffffe00,
               in_stack_fffffffffffffdfc);
    internal::LogMessage::operator<<
              (in_stack_fffffffffffffe00,
               (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffe00,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    internal::LogMessage::~LogMessage((LogMessage *)0x4ba1e4);
  }
  this_00 = (DescriptorBuilder *)(in_RDI + 4);
  std::
  unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                *)0x4ba1f7);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x4ba203);
  std::
  unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                *)0x4ba20d);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x4ba219);
  std::
  unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  ::get((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
         *)this_00);
  DescriptorBuilder::DescriptorBuilder
            (in_stack_fffffffffffffe60,(DescriptorPool *)in_stack_fffffffffffffe58,
             in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  pFVar1 = DescriptorBuilder::BuildFile
                     (in_stack_fffffffffffffe58,(FileDescriptorProto *)in_stack_fffffffffffffe50);
  DescriptorBuilder::~DescriptorBuilder(this_00);
  return pFVar1;
}

Assistant:

const FileDescriptor* DescriptorPool::BuildFileCollectingErrors(
    const FileDescriptorProto& proto, ErrorCollector* error_collector) {
  GOOGLE_CHECK(fallback_database_ == nullptr)
      << "Cannot call BuildFile on a DescriptorPool that uses a "
         "DescriptorDatabase.  You must instead find a way to get your file "
         "into the underlying database.";
  GOOGLE_CHECK(mutex_ == nullptr);  // Implied by the above GOOGLE_CHECK.
  tables_->known_bad_symbols_.clear();
  tables_->known_bad_files_.clear();
  return DescriptorBuilder(this, tables_.get(), error_collector)
      .BuildFile(proto);
}